

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::SharedBasicVarCase::SharedBasicVarCase
          (SharedBasicVarCase *this,Context *context,char *name,DataType basicType,
          Precision precision,UVec3 *workGroupSize)

{
  char *description;
  undefined4 in_register_00000084;
  string local_50;
  UVec3 *local_30;
  UVec3 *workGroupSize_local;
  Precision precision_local;
  DataType basicType_local;
  char *name_local;
  Context *context_local;
  SharedBasicVarCase *this_local;
  
  local_30 = workGroupSize;
  workGroupSize_local._0_4_ = precision;
  workGroupSize_local._4_4_ = basicType;
  _precision_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  getBasicCaseDescription_abi_cxx11_
            (&local_50,(Functional *)(ulong)basicType,precision,(Precision)workGroupSize,
             (UVec3 *)CONCAT44(in_register_00000084,precision));
  description = (char *)std::__cxx11::string::c_str();
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SharedBasicVarCase_032be160;
  this->m_basicType = workGroupSize_local._4_4_;
  this->m_precision = (Precision)workGroupSize_local;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,local_30);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

SharedBasicVarCase::SharedBasicVarCase (Context& context, const char* name, DataType basicType, Precision precision, const tcu::UVec3& workGroupSize)
	: TestCase			(context, name, getBasicCaseDescription(basicType, precision, workGroupSize).c_str())
	, m_basicType		(basicType)
	, m_precision		(precision)
	, m_workGroupSize	(workGroupSize)
	, m_program			(DE_NULL)
{
}